

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

char * coda_type_get_native_type_name(coda_native_type native_type)

{
  if ((uint)(native_type + coda_native_type_uint8) < 0xe) {
    return &DAT_001b7084 +
           *(int *)(&DAT_001b7084 + (ulong)(uint)(native_type + coda_native_type_uint8) * 4);
  }
  return "unknown";
}

Assistant:

LIBCODA_API const char *coda_type_get_native_type_name(coda_native_type native_type)
{
    switch (native_type)
    {
        case coda_native_type_not_available:
            return "N/A";
        case coda_native_type_int8:
            return "int8";
        case coda_native_type_uint8:
            return "uint8";
        case coda_native_type_int16:
            return "int16";
        case coda_native_type_uint16:
            return "uint16";
        case coda_native_type_int32:
            return "int32";
        case coda_native_type_uint32:
            return "uint32";
        case coda_native_type_int64:
            return "int64";
        case coda_native_type_uint64:
            return "uint64";
        case coda_native_type_float:
            return "float";
        case coda_native_type_double:
            return "double";
        case coda_native_type_char:
            return "char";
        case coda_native_type_string:
            return "string";
        case coda_native_type_bytes:
            return "bytes";
    }

    return "unknown";
}